

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_xlat.cpp
# Opt level: O0

void P_LoadTranslator(char *lumpname)

{
  undefined1 auVar1 [80];
  int iVar2;
  undefined4 uStack_c4;
  FParseToken tok;
  undefined1 local_68 [8];
  XlatParseContext context;
  void *pParser;
  char *lumpname_local;
  
  iVar2 = FString::CompareNoCase(&LastTranslator,lumpname);
  if (iVar2 != 0) {
    P_ClearTranslator();
    context._72_8_ = XlatParseAlloc(malloc);
    XlatParseContext::XlatParseContext
              ((XlatParseContext *)local_68,(void *)context._72_8_,XlatParse,TokenTrans);
    FParseContext::ParseLump((FParseContext *)local_68,lumpname);
    auVar1._4_8_ = tok.symval;
    auVar1._0_4_ = uStack_c4;
    auVar1._12_8_ = tok._8_8_;
    auVar1._20_8_ = tok._16_8_;
    auVar1._28_8_ = tok._24_8_;
    auVar1._36_8_ = tok._32_8_;
    auVar1._44_8_ = tok._40_8_;
    auVar1._52_8_ = tok._48_8_;
    auVar1._60_8_ = tok._56_8_;
    auVar1._68_8_ = tok._64_8_;
    auVar1._76_4_ = 0;
    XlatParse((void *)context._72_8_,0,(FParseToken)(auVar1 << 0x20),(FParseContext *)local_68);
    XlatParseFree((void *)context._72_8_,free);
    FString::operator=(&LastTranslator,lumpname);
    XlatParseContext::~XlatParseContext((XlatParseContext *)local_68);
  }
  return;
}

Assistant:

void P_LoadTranslator(const char *lumpname)
{
	// Only read the lump if it differs from the previous one.
	if (LastTranslator.CompareNoCase(lumpname))
	{
		// Clear the old data before parsing the lump.
		P_ClearTranslator();

		void *pParser = XlatParseAlloc(malloc);

		XlatParseContext context(pParser, XlatParse, TokenTrans);

		context.ParseLump(lumpname);
		FParseToken tok;
		tok.val=0;
		XlatParse(pParser, 0, tok, &context);
		XlatParseFree(pParser, free);
		LastTranslator = lumpname;
	}
}